

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O3

double gammainv(double p,double k,double th)

{
  uint uVar1;
  char *__format;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if ((p < 0.0) || (1.0 < p)) {
    __format = "Probablity Values can only take values between 0.0 and 1.0";
  }
  else {
    if ((0.0 < k) && (0.0 < th)) {
      dVar3 = (double)(-(ulong)(p == 1.0) & 0x7fefdcf158adbb99);
      if ((0.0 < p) && (p < 1.0)) {
        dVar3 = log(k + 1.0);
        dVar4 = log(k);
        dVar3 = dVar3 - dVar4;
        dVar4 = log(k);
        dVar7 = dVar3 + dVar3;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar5 = erfcinv(p + p);
        dVar3 = exp((dVar3 * -0.5 + dVar4) - dVar5 * dVar7);
        dVar4 = eps(2.2251e-308);
        if (dVar3 * dVar4 < 1.0) {
          dVar7 = dVar3;
          uVar1 = 0;
          do {
            dVar3 = gammacdf(dVar7,k,1.0);
            dVar5 = gammapdf(dVar7,k,1.0);
            dVar5 = r8_max(dVar5,2.2251e-308);
            dVar5 = (dVar3 - p) / dVar5;
            dVar6 = dVar7 - dVar5;
            dVar3 = dVar6;
            if (dVar6 <= 0.0) {
              dVar3 = dVar7 / 10.0;
            }
          } while ((dVar4 * dVar3 <
                    ABS((double)(~-(ulong)(0.0 < dVar6) & (ulong)(dVar7 - dVar7 / 10.0) |
                                (ulong)dVar5 & -(ulong)(0.0 < dVar6)))) &&
                  (bVar2 = uVar1 < 999, dVar7 = dVar3, uVar1 = uVar1 + 1, bVar2));
        }
        dVar3 = dVar3 * th;
      }
      return dVar3;
    }
    __format = "Gamma Distribution parameters must be positive and real.";
  }
  printf(__format);
  exit(1);
}

Assistant:

double gammainv(double p, double k, double th) {
	double oup,x,xi,del,mu,sigma2,cvar;
	int m;
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	}
	
	if (k <= 0. || th <= 0.) {
		printf("Gamma Distribution parameters must be positive and real.");
		exit(1);
	}
	
	if (p == 0.) {
		oup = 0.0;
	} 
	
	if ( p == 1.) {
		oup = XINFVAL;
	}
	
	if ( p > 0.0 && p < 1.0) {
		// Use Newton's Method to find cdf inverse of gamma distribution
		
		// Initialization is based on lognormal distribution with
		// mean and variance k
		
		sigma2 = log(1+k) - log(k);
		mu = log(k) - 0.5 * sigma2;
		xi = exp(mu - sqrt(2. * sigma2) * erfcinv(2*p));
		
		del = 1.0;
		
		cvar = eps(XNINFVAL);
		m = 0;
		
		
		//Iterations
		
		while ( ( fabs(del) > cvar * xi) &&  (m < 1000)) {
			del = (gammacdf(xi,k,1.0) - p) / r8_max(gammapdf(xi,k,1.0), XNINFVAL);
			//printf("%g %g \n",xi*cvar,del);
			m++;
			x = xi - del;
			
			if (x <= 0.) {
				x = xi / 10.;
				del = xi - x;
			}
			xi = x;
		}
		oup = xi * th;
	}
	
	return oup;
}